

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

boolean dump_buffer(working_state *state)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *in_RDI;
  jpeg_destination_mgr *dest;
  uint local_4;
  
  puVar1 = *(undefined8 **)(in_RDI[6] + 0x28);
  iVar2 = (*(code *)puVar1[3])(in_RDI[6]);
  if (iVar2 != 0) {
    *in_RDI = *puVar1;
    in_RDI[1] = puVar1[1];
  }
  local_4 = (uint)(iVar2 != 0);
  return local_4;
}

Assistant:

LOCAL(void)
dump_buffer(phuff_entropy_ptr entropy)
/* Empty the output buffer; we do not support suspension in this module. */
{
  struct jpeg_destination_mgr *dest = entropy->cinfo->dest;

  if (!(*dest->empty_output_buffer) (entropy->cinfo))
    ERREXIT(entropy->cinfo, JERR_CANT_SUSPEND);
  /* After a successful buffer dump, must reset buffer pointers */
  entropy->next_output_byte = dest->next_output_byte;
  entropy->free_in_buffer = dest->free_in_buffer;
}